

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O2

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,string *v)

{
  char **ppcVar1;
  size_t __n;
  char *__dest;
  
  __n = v->_M_string_length;
  ppcVar1 = &(this->m_buffer).m_cur;
  __dest = (this->m_buffer).m_cur;
  if ((int)__n < (int)ppcVar1 - (int)__dest) {
    memcpy(__dest,(v->_M_dataplus)._M_p,__n);
    *ppcVar1 = *ppcVar1 + __n;
  }
  return this;
}

Assistant:

LogStream& operator<<(const std::string& v){
		m_buffer.append(v.c_str(), v.size());

		return *this;
	}